

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

void __thiscall
wabt::(anonymous_namespace)::CWriter::
Write<char_const(&)[32],wabt::(anonymous_namespace)::GlobalName,char_const(&)[9],wabt::(anonymous_namespace)::Newline>
          (CWriter *this,char (*t) [32],GlobalName *u,char (*args) [9],Newline *args_1)

{
  string_view local_40;
  Newline *local_30;
  Newline *args_local_1;
  char (*args_local) [9];
  GlobalName *u_local;
  char (*t_local) [32];
  CWriter *this_local;
  
  local_30 = args_1;
  args_local_1 = (Newline *)args;
  args_local = (char (*) [9])u;
  u_local = (GlobalName *)t;
  t_local = (char (*) [32])this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_40,*t);
  anon_unknown_0::CWriter::Write((CWriter *)this,local_40);
  anon_unknown_0::CWriter::Write((CWriter *)this,(GlobalName *)args_local);
  Write<char_const(&)[9],wabt::(anonymous_namespace)::Newline>
            (this,(char (*) [9])args_local_1,local_30);
  return;
}

Assistant:

void Write(T&& t, U&& u, Args&&... args) {
    Write(std::forward<T>(t));
    Write(std::forward<U>(u));
    Write(std::forward<Args>(args)...);
  }